

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bezier.h
# Opt level: O3

void __thiscall
bezier::BinomialCoefficients<4UL>::BinomialCoefficients(BinomialCoefficients<4UL> *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  (this->mCoefficients)._M_elems[0] = 0;
  (this->mCoefficients)._M_elems[1] = 0;
  (this->mCoefficients)._M_elems[2] = 0;
  (this->mCoefficients)._M_elems[3] = 0;
  (this->mCoefficients)._M_elems[4] = 0;
  (this->mCoefficients)._M_elems[0] = 1;
  (this->mCoefficients)._M_elems[1] = 4;
  (this->mCoefficients)._M_elems[2] = 6;
  auVar1 = *(undefined1 (*) [16])(this->mCoefficients)._M_elems;
  auVar2._0_8_ = auVar1._8_8_;
  auVar2._8_4_ = auVar1._0_4_;
  auVar2._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])((this->mCoefficients)._M_elems + 3) = auVar2;
  return;
}

Assistant:

BinomialCoefficients()
        {
            size_t center = N / 2;
            size_t k = 0;

            while (k <= center)
            {
                mCoefficients[k] = internal::binomial(N, k);
                k++;
            }

            // Utilize the symmetrical nature of the binomial coefficients.
            while (k <= N)
            {
                mCoefficients[k] = mCoefficients[N - k];
                k++;
            }
        }